

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

bool __thiscall
QCache<QtFontFallbacksCacheKey,_QList<QString>_>::insert
          (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *this,QtFontFallbacksCacheKey *key,
          QList<QString> *object,qsizetype cost)

{
  long lVar1;
  Chain *pCVar2;
  Node *n;
  longlong __tmp;
  long lVar3;
  long in_FS_OFFSET;
  Value local_68;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->mx;
  if (lVar1 < cost) {
    remove(this,(char *)key);
    if (object != (QList<QString> *)0x0) {
      QArrayDataPointer<QString>::~QArrayDataPointer(&object->d);
    }
    operator_delete(object,0x18);
  }
  else {
    trim(this,lVar1 - cost);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::
    findOrInsert<QtFontFallbacksCacheKey>((InsertionResult *)local_58,&this->d,key);
    n = (Node *)((((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries)->storage
                 ).data + (uint)(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].
                                offsets[(uint)local_58._8_8_ & 0x7f] * 0x48);
    if (local_58[0x10] == true) {
      lVar3 = (n->value).cost;
      local_68.t = (n->value).t;
      (n->value).t = object;
      (n->value).cost = cost;
      local_68.cost = lVar3;
      Value::~Value(&local_68);
      relink(this,key);
      lVar3 = cost - lVar3;
    }
    else {
      Node::createInPlace(n,key,object,cost);
      (n->super_Chain).prev = &this->chain;
      pCVar2 = (this->chain).next;
      (n->super_Chain).next = pCVar2;
      pCVar2->prev = (Chain *)n;
      (this->chain).next = (Chain *)n;
      lVar3 = cost;
    }
    this->total = this->total + lVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cost <= lVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }